

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

code_point __thiscall
tcb::unicode::detail::utf_traits<char16_t,2>::
decode<std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>>
          (utf_traits<char16_t,2> *this,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *current,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last)

{
  bool bVar1;
  int_type iVar2;
  int_type iVar3;
  code_point cVar4;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> iVar5;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> local_40;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last_local;
  
  last_local._M_c = (int_type)last._M_sbuf;
  last_local._M_sbuf = (streambuf_type *)current;
  bVar1 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::equal
                    ((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this,&last_local)
  ;
  cVar4 = L'\xfffffffe';
  if (!bVar1) {
    iVar5 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator++
                      ((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this,0);
    local_40._M_sbuf = iVar5._M_sbuf;
    local_40._M_c = iVar5._M_c;
    iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&local_40);
    if ((ushort)(iVar2 + 0x2000) < 0xf800) {
      cVar4 = (uint)iVar2;
    }
    else {
      cVar4 = L'\xffffffff';
      if ((iVar2 < 0xdc00) &&
         (bVar1 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::equal
                            ((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this,
                             &last_local), cVar4 = L'\xfffffffe', !bVar1)) {
        iVar5 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::operator++
                          ((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this,0);
        local_40._M_sbuf = iVar5._M_sbuf;
        local_40._M_c = iVar5._M_c;
        iVar3 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&local_40);
        cVar4 = L'\xffffffff';
        if (0xfbff < (ushort)(iVar3 + 0x2000)) {
          cVar4 = (iVar2 & 0x3ff) * 0x400 + (iVar3 & 0x3ff) + L'𐀀';
        }
      }
    }
  }
  return cVar4;
}

Assistant:

static TCB_CONSTEXPR14 code_point decode(It& current, S last)
    {
        if (TCB_UNLIKELY(current == last))
            return incomplete;
        uint16_t w1 = *current++;
        if (TCB_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
            return w1;
        }
        if (w1 > 0xDBFF)
            return illegal;
        if (current == last)
            return incomplete;
        uint16_t w2 = *current++;
        if (w2 < 0xDC00 || 0xDFFF < w2)
            return illegal;
        return combine_surrogate(w1, w2);
    }